

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

void board_print(Board *board,_Bool showDownCards)

{
  SPOTTYPE SVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uchar spotTypesCount;
  byte local_39;
  SPOTTYPE *local_38;
  
  local_38 = board_getSpotTypes(board,&local_39);
  if ((ulong)local_39 != 0) {
    bVar2 = board->spotsCount;
    uVar4 = 0;
    bVar3 = bVar2;
    do {
      if (bVar3 == 0) {
        bVar3 = 0;
      }
      else {
        uVar5 = 0;
        SVar1 = local_38[uVar4];
        do {
          if (board->spots[uVar5]->type == SVar1) {
            spot_print(board->spots[uVar5],showDownCards);
            bVar2 = board->spotsCount;
          }
          uVar5 = uVar5 + 1;
          bVar3 = bVar2;
        } while (uVar5 < bVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_39);
  }
  free(local_38);
  return;
}

Assistant:

void board_print(Board * board, bool showDownCards)
{
	unsigned char i, j, spotTypesCount;
	Spot * spot;
	SPOTTYPE spotType;
	SPOTTYPE * spotTypes = board_getSpotTypes(board, &spotTypesCount);

	for(i=0;i<spotTypesCount;i++)
	{
		spotType = spotTypes[i];
		for(j=0;j<board->spotsCount;j++)
		{
			spot = board->spots[j];
			if(spot->type==spotType)
				spot_print(spot, showDownCards);
		}
	}

	free(spotTypes);
}